

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O3

uint __thiscall
llvm::MCRegisterInfo::getSubRegIndex(MCRegisterInfo *this,MCRegister Reg,MCRegister SubReg)

{
  uint16_t *puVar1;
  ushort *puVar2;
  uint uVar3;
  uint uVar4;
  MCSubRegIterator local_40;
  
  if ((SubReg.Reg != 0) && (SubReg.Reg < this->NumRegs)) {
    if (this->NumRegs <= Reg.Reg) {
      __assert_fail("RegNo < NumRegs && \"Attempting to access record for invalid register number!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/MC/MCRegisterInfo.h"
                    ,0x14b,
                    "const MCRegisterDesc &llvm::MCRegisterInfo::operator[](MCRegister) const");
    }
    puVar1 = this->SubRegIndices;
    uVar4 = this->Desc[Reg.Reg].SubRegIndices;
    uVar3 = 0;
    MCSubRegIterator::MCSubRegIterator(&local_40,Reg,this,false);
    if (local_40.super_DiffListIterator.List != (ushort *)0x0) {
      uVar3 = (uint)local_40.super_DiffListIterator.Val;
      puVar2 = puVar1 + uVar4;
      uVar4 = (uint)local_40.super_DiffListIterator.Val;
      while (uVar4 != SubReg.Reg) {
        uVar3 = uVar3 + *local_40.super_DiffListIterator.List;
        if (*local_40.super_DiffListIterator.List == 0) {
          return 0;
        }
        local_40.super_DiffListIterator.List = local_40.super_DiffListIterator.List + 1;
        puVar2 = puVar2 + 1;
        uVar4 = uVar3 & 0xffff;
      }
      uVar3 = (uint)*puVar2;
    }
    return uVar3;
  }
  __assert_fail("SubReg && SubReg < getNumRegs() && \"This is not a register\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/MCRegisterInfo.cpp"
                ,0x2e,
                "unsigned int llvm::MCRegisterInfo::getSubRegIndex(MCRegister, MCRegister) const");
}

Assistant:

unsigned MCRegisterInfo::getSubRegIndex(MCRegister Reg,
                                        MCRegister SubReg) const {
  assert(SubReg && SubReg < getNumRegs() && "This is not a register");
  // Get a pointer to the corresponding SubRegIndices list. This list has the
  // name of each sub-register in the same order as MCSubRegIterator.
  const uint16_t *SRI = SubRegIndices + get(Reg).SubRegIndices;
  for (MCSubRegIterator Subs(Reg, this); Subs.isValid(); ++Subs, ++SRI)
    if (*Subs == SubReg)
      return *SRI;
  return 0;
}